

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O1

string * path_cat_abi_cxx11_(string *__return_storage_ptr__,string_view base,string_view path)

{
  char *pcVar1;
  
  pcVar1 = path.ptr_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (base.len_ == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path.len_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,base.ptr_,base.ptr_ + base.len_);
    if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        '/') {
      std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,(char)__return_storage_ptr__->_M_string_length + -1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
path_cat(
    beast::string_view base,
    beast::string_view path)
{
    if(base.empty())
        return std::string(path);
    std::string result(base);
#ifdef BOOST_MSVC
    char constexpr path_separator = '\\';
    if(result.back() == path_separator)
        result.resize(result.size() - 1);
    result.append(path.data(), path.size());
    for(auto& c : result)
        if(c == '/')
            c = path_separator;
#else
    char constexpr path_separator = '/';
    if(result.back() == path_separator)
        result.resize(result.size() - 1);
    result.append(path.data(), path.size());
#endif
    return result;
}